

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O3

void __thiscall Sparse_matrix_Construct(void *this,uint size,uint nzcount)

{
  int *piVar1;
  void *pvVar2;
  ulong uVar3;
  
  *(uint *)this = size;
  uVar3 = (ulong)(size + nzcount + 1);
  piVar1 = (int *)malloc(uVar3 * 4);
  *(int **)((long)this + 8) = piVar1;
  pvVar2 = malloc(uVar3 << 3);
  *(void **)((long)this + 0x10) = pvVar2;
  *(undefined4 *)((long)this + 0x18) = 0;
  *piVar1 = size + 1;
  *(uint *)((long)this + 0x1c) = size;
  return;
}

Assistant:

void Sparse_matrix_Construct (
    Sparse_matrix * this,
    unsigned size,
    unsigned nzcount) {

  this->size = size;
  this->indices = NEW(unsigned, size + nzcount + 1);
  this->elements = NEW(double, size + nzcount + 1);

  Sparse_matrix_Clear (this);
}